

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::MILSpec::Operation::_InternalSerialize
          (Operation *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedPtrField<CoreML::Specification::MILSpec::Block> *this_00;
  MapFieldLite<CoreML::Specification::MILSpec::Operation_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *pMVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  undefined8 *puVar7;
  void *pvVar8;
  Type *this_01;
  Type *this_02;
  int iVar9;
  ulong uVar10;
  Operation *pOVar11;
  uint8_t *puVar12;
  size_type i;
  ulong uVar13;
  size_t __n;
  const_iterator it;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
  local_68;
  Operation *local_50;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
  local_48;
  
  puVar7 = (undefined8 *)((ulong)(this->type_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar5 = puVar7[1];
  if (lVar5 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar7,(int)lVar5,SERIALIZE,"CoreML.Specification.MILSpec.Operation.type");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(string *)
                                 ((ulong)(this->type_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),target
                       );
  }
  uVar10 = (this->inputs_).map_.elements_.num_elements_;
  local_50 = this;
  if (uVar10 != 0) {
    local_48.m_ = (InnerMap *)&this->inputs_;
    if ((uVar10 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
      ::InnerMap::
      iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
      ::SearchFrom((iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
                    *)&local_48,(this->inputs_).map_.elements_.index_of_first_non_null_);
      local_68.m_ = local_48.m_;
      local_68.node_ = local_48.node_;
      while (local_68.node_ != (Node *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                 ::InternalSerialize(2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_68.node_,(Argument *)&(local_68.node_)->field_0x20,
                                     target,stream);
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  (*(char **)local_68.node_,(int)*(size_type *)&(local_68.node_)->field_0x8,
                   SERIALIZE,"CoreML.Specification.MILSpec.Operation.InputsEntry.key");
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
        ::InnerMap::
        iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
        ::operator++((iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
                      *)&local_68);
      }
    }
    else {
      pvVar8 = operator_new__(-(ulong)(uVar10 >> 0x3d != 0) | uVar10 << 3);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
      ::InnerMap::
      iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
      ::SearchFrom((iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
                    *)&local_48,(this->inputs_).map_.elements_.index_of_first_non_null_);
      uVar10 = 0;
      local_68.m_ = local_48.m_;
      local_68.node_ = local_48.node_;
      while (local_68.node_ != (Node *)0x0) {
        *(Node **)((long)pvVar8 + uVar10 * 8) = local_68.node_;
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
        ::InnerMap::
        iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
        ::operator++((iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
                      *)&local_68);
        uVar10 = uVar10 + 1;
      }
      if (uVar10 != 0) {
        pvVar2 = (void *)((long)pvVar8 + uVar10 * 8);
        lVar5 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        std::
        __introsort_loop<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Argument>const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Argument>const*>>>
                  (pvVar8,pvVar2,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Argument>const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Argument>const*>>>
                  (pvVar8,pvVar2);
        uVar13 = 0;
        do {
          pbVar6 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    ((long)pvVar8 + uVar13 * 8);
          target = google::protobuf::internal::
                   MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                   ::InternalSerialize(2,pbVar6,(Argument *)(pbVar6 + 1),target,stream);
          puVar7 = *(undefined8 **)((long)pvVar8 + uVar13 * 8);
          google::protobuf::internal::WireFormatLite::VerifyUtf8String
                    ((char *)*puVar7,*(int *)(puVar7 + 1),SERIALIZE,
                     "CoreML.Specification.MILSpec.Operation.InputsEntry.key");
          uVar13 = uVar13 + 1;
        } while (uVar10 != uVar13);
      }
      operator_delete__(pvVar8);
      this = local_50;
    }
  }
  iVar3 = (this->outputs_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar3 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::TypeHandler>
                          (&(this->outputs_).super_RepeatedPtrFieldBase,iVar9);
      *target = '\x1a';
      uVar4 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
      target[1] = (uint8_t)uVar4;
      if (uVar4 < 0x80) {
        puVar12 = target + 2;
      }
      else {
        puVar12 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                            (uVar4,target + 1);
      }
      target = NamedValueType::_InternalSerialize(this_01,puVar12,stream);
      iVar9 = iVar9 + 1;
    } while (iVar3 != iVar9);
  }
  iVar3 = (local_50->blocks_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar3 != 0) {
    this_00 = &local_50->blocks_;
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_02 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Block>::TypeHandler>
                          (&this_00->super_RepeatedPtrFieldBase,iVar9);
      *target = '\"';
      uVar4 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
      target[1] = (uint8_t)uVar4;
      if (uVar4 < 0x80) {
        puVar12 = target + 2;
      }
      else {
        puVar12 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                            (uVar4,target + 1);
      }
      target = Block::_InternalSerialize(this_02,puVar12,stream);
      iVar9 = iVar9 + 1;
    } while (iVar3 != iVar9);
  }
  pOVar11 = local_50;
  uVar10 = (local_50->attributes_).map_.elements_.num_elements_;
  if (uVar10 != 0) {
    pMVar1 = &local_50->attributes_;
    if ((uVar10 == 1) || (stream->is_serialization_deterministic_ == false)) {
      local_48.m_ = (InnerMap *)pMVar1;
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
      ::InnerMap::
      iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
      ::SearchFrom(&local_48,(local_50->attributes_).map_.elements_.index_of_first_non_null_);
      local_68.m_ = local_48.m_;
      local_68.node_ = local_48.node_;
      while (local_68.node_ != (Node *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                 ::InternalSerialize(5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_68.node_,(Value *)&(local_68.node_)->field_0x20,
                                     target,stream);
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  (*(char **)local_68.node_,(int)*(size_type *)&(local_68.node_)->field_0x8,
                   SERIALIZE,"CoreML.Specification.MILSpec.Operation.AttributesEntry.key");
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
        ::InnerMap::
        iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
        ::operator++(&local_68);
      }
    }
    else {
      pvVar8 = operator_new__(-(ulong)(uVar10 >> 0x3d != 0) | uVar10 << 3);
      local_48.m_ = (InnerMap *)pMVar1;
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
      ::InnerMap::
      iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
      ::SearchFrom(&local_48,(pOVar11->attributes_).map_.elements_.index_of_first_non_null_);
      uVar10 = 0;
      local_68.m_ = local_48.m_;
      local_68.node_ = local_48.node_;
      while (local_68.node_ != (Node *)0x0) {
        *(Node **)((long)pvVar8 + uVar10 * 8) = local_68.node_;
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
        ::InnerMap::
        iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
        ::operator++(&local_68);
        uVar10 = uVar10 + 1;
      }
      if (uVar10 != 0) {
        pvVar2 = (void *)((long)pvVar8 + uVar10 * 8);
        lVar5 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        std::
        __introsort_loop<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const*>>>
                  (pvVar8,pvVar2,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const*>>>
                  (pvVar8,pvVar2);
        uVar13 = 0;
        do {
          pbVar6 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    ((long)pvVar8 + uVar13 * 8);
          target = google::protobuf::internal::
                   MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                   ::InternalSerialize(5,pbVar6,(Value *)(pbVar6 + 1),target,stream);
          puVar7 = *(undefined8 **)((long)pvVar8 + uVar13 * 8);
          google::protobuf::internal::WireFormatLite::VerifyUtf8String
                    ((char *)*puVar7,*(int *)(puVar7 + 1),SERIALIZE,
                     "CoreML.Specification.MILSpec.Operation.AttributesEntry.key");
          uVar13 = uVar13 + 1;
        } while (uVar10 != uVar13);
      }
      operator_delete__(pvVar8);
      pOVar11 = local_50;
    }
  }
  uVar10 = (pOVar11->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar10 & 1) != 0) {
    pvVar8 = *(void **)((uVar10 & 0xfffffffffffffffc) + 8);
    uVar10 = (pOVar11->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar10 & 1) == 0) {
      puVar7 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar7 = (undefined8 *)((uVar10 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar7[1];
    if ((long)stream->end_ - (long)target < (long)__n) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar8,(int)puVar7[1],target);
    }
    else {
      memcpy(target,pvVar8,__n);
      target = target + __n;
    }
  }
  return target;
}

Assistant:

uint8_t* Operation::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MILSpec.Operation)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // string type = 1;
  if (!this->_internal_type().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_type().data(), static_cast<int>(this->_internal_type().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.MILSpec.Operation.type");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_type(), target);
  }

  // map<string, .CoreML.Specification.MILSpec.Argument> inputs = 2;
  if (!this->_internal_inputs().empty()) {
    typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Argument >::const_pointer
        ConstPtr;
    typedef ConstPtr SortItem;
    typedef ::PROTOBUF_NAMESPACE_ID::internal::CompareByDerefFirst<SortItem> Less;
    struct Utf8Check {
      static void Check(ConstPtr p) {
        (void)p;
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
          p->first.data(), static_cast<int>(p->first.length()),
          ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.MILSpec.Operation.InputsEntry.key");
      }
    };

    if (stream->IsSerializationDeterministic() &&
        this->_internal_inputs().size() > 1) {
      ::std::unique_ptr<SortItem[]> items(
          new SortItem[this->_internal_inputs().size()]);
      typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Argument >::size_type size_type;
      size_type n = 0;
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Argument >::const_iterator
          it = this->_internal_inputs().begin();
          it != this->_internal_inputs().end(); ++it, ++n) {
        items[static_cast<ptrdiff_t>(n)] = SortItem(&*it);
      }
      ::std::sort(&items[0], &items[static_cast<ptrdiff_t>(n)], Less());
      for (size_type i = 0; i < n; i++) {
        target = Operation_InputsEntry_DoNotUse::Funcs::InternalSerialize(2, items[static_cast<ptrdiff_t>(i)]->first, items[static_cast<ptrdiff_t>(i)]->second, target, stream);
        Utf8Check::Check(&(*items[static_cast<ptrdiff_t>(i)]));
      }
    } else {
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Argument >::const_iterator
          it = this->_internal_inputs().begin();
          it != this->_internal_inputs().end(); ++it) {
        target = Operation_InputsEntry_DoNotUse::Funcs::InternalSerialize(2, it->first, it->second, target, stream);
        Utf8Check::Check(&(*it));
      }
    }
  }

  // repeated .CoreML.Specification.MILSpec.NamedValueType outputs = 3;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_outputs_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(3, this->_internal_outputs(i), target, stream);
  }

  // repeated .CoreML.Specification.MILSpec.Block blocks = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_blocks_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(4, this->_internal_blocks(i), target, stream);
  }

  // map<string, .CoreML.Specification.MILSpec.Value> attributes = 5;
  if (!this->_internal_attributes().empty()) {
    typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::const_pointer
        ConstPtr;
    typedef ConstPtr SortItem;
    typedef ::PROTOBUF_NAMESPACE_ID::internal::CompareByDerefFirst<SortItem> Less;
    struct Utf8Check {
      static void Check(ConstPtr p) {
        (void)p;
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
          p->first.data(), static_cast<int>(p->first.length()),
          ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.MILSpec.Operation.AttributesEntry.key");
      }
    };

    if (stream->IsSerializationDeterministic() &&
        this->_internal_attributes().size() > 1) {
      ::std::unique_ptr<SortItem[]> items(
          new SortItem[this->_internal_attributes().size()]);
      typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::size_type size_type;
      size_type n = 0;
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::const_iterator
          it = this->_internal_attributes().begin();
          it != this->_internal_attributes().end(); ++it, ++n) {
        items[static_cast<ptrdiff_t>(n)] = SortItem(&*it);
      }
      ::std::sort(&items[0], &items[static_cast<ptrdiff_t>(n)], Less());
      for (size_type i = 0; i < n; i++) {
        target = Operation_AttributesEntry_DoNotUse::Funcs::InternalSerialize(5, items[static_cast<ptrdiff_t>(i)]->first, items[static_cast<ptrdiff_t>(i)]->second, target, stream);
        Utf8Check::Check(&(*items[static_cast<ptrdiff_t>(i)]));
      }
    } else {
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::const_iterator
          it = this->_internal_attributes().begin();
          it != this->_internal_attributes().end(); ++it) {
        target = Operation_AttributesEntry_DoNotUse::Funcs::InternalSerialize(5, it->first, it->second, target, stream);
        Utf8Check::Check(&(*it));
      }
    }
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MILSpec.Operation)
  return target;
}